

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O2

void yy_switch_to_buffer(YY_BUFFER_STATE new_buffer)

{
  YY_BUFFER_STATE *ppyVar1;
  size_t sVar2;
  char *pcVar3;
  
  yyensure_buffer_stack();
  pcVar3 = yy_c_buf_p;
  sVar2 = yy_buffer_stack_top;
  ppyVar1 = yy_buffer_stack;
  if (yy_buffer_stack == (YY_BUFFER_STATE *)0x0) {
    if (new_buffer == (YY_BUFFER_STATE)0x0) {
      return;
    }
  }
  else {
    if (yy_buffer_stack[yy_buffer_stack_top] == new_buffer) {
      return;
    }
    if (yy_buffer_stack[yy_buffer_stack_top] != (YY_BUFFER_STATE)0x0) {
      *yy_c_buf_p = yy_hold_char;
      ppyVar1[sVar2]->yy_buf_pos = pcVar3;
      ppyVar1[sVar2]->yy_n_chars = yy_n_chars;
    }
  }
  ppyVar1[sVar2] = new_buffer;
  yy_load_buffer_state();
  return;
}

Assistant:

void yy_switch_to_buffer  (YY_BUFFER_STATE  new_buffer )
{
    
	/* TODO. We should be able to replace this entire function body
	 * with
	 *		yypop_buffer_state();
	 *		yypush_buffer_state(new_buffer);
     */
	yyensure_buffer_stack ();
	if ( YY_CURRENT_BUFFER == new_buffer )
		return;

	if ( YY_CURRENT_BUFFER )
		{
		/* Flush out information for old buffer. */
		*(yy_c_buf_p) = (yy_hold_char);
		YY_CURRENT_BUFFER_LVALUE->yy_buf_pos = (yy_c_buf_p);
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = (yy_n_chars);
		}

	YY_CURRENT_BUFFER_LVALUE = new_buffer;
	yy_load_buffer_state(  );

	/* We don't actually know whether we did this switch during
	 * EOF (yywrap()) processing, but the only time this flag
	 * is looked at is after yywrap() is called, so it's safe
	 * to go ahead and always set it.
	 */
	(yy_did_buffer_switch_on_eof) = 1;
}